

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.cpp
# Opt level: O1

int __thiscall MeCab::Param::open(Param *this,char *__file,int __oflag,...)

{
  char cVar1;
  int iVar2;
  char *__dest;
  ulong uVar3;
  char *pcVar4;
  char *ptr [64];
  char *local_238 [65];
  
  __dest = (char *)operator_new__(0x2000);
  strncpy(__dest,__file,0x2000);
  local_238[0] = "open_jtalk";
  if (*__dest == '\0') {
    uVar3 = 1;
  }
  else {
    uVar3 = 1;
    pcVar4 = __dest;
    do {
      cVar1 = *pcVar4;
      iVar2 = isspace((int)cVar1);
      while (iVar2 != 0) {
        *pcVar4 = '\0';
        cVar1 = pcVar4[1];
        iVar2 = isspace((int)cVar1);
        pcVar4 = pcVar4 + 1;
      }
      if (cVar1 == '\0') break;
      local_238[uVar3] = pcVar4;
      uVar3 = uVar3 + 1;
      if (uVar3 == 0x200) {
        uVar3 = 0x200;
        break;
      }
      cVar1 = *pcVar4;
      while ((cVar1 != '\0' && (iVar2 = isspace((int)cVar1), iVar2 == 0))) {
        cVar1 = pcVar4[1];
        pcVar4 = pcVar4 + 1;
      }
    } while (*pcVar4 != '\0');
  }
  iVar2 = open(this,(char *)(uVar3 & 0xffffffff),(int)local_238,___oflag);
  operator_delete__(__dest);
  return iVar2;
}

Assistant:

bool Param::open(const char *arg, const Option *opts) {
  scoped_fixed_array<char, BUF_SIZE> str;
  std::strncpy(str.get(), arg, str.size());
  char* ptr[64];
  unsigned int size = 1;
  ptr[0] = const_cast<char*>(PACKAGE);

  for (char *p = str.get(); *p;) {
    while (isspace(*p)) *p++ = '\0';
    if (*p == '\0') break;
    ptr[size++] = p;
    if (size == sizeof(ptr)) break;
    while (*p && !isspace(*p)) p++;
  }

  return open(size, ptr, opts);
}